

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

upb_DecodeStatus
upb_Decode(char *buf,size_t size,upb_Message *msg,upb_MiniTable *mt,upb_ExtensionRegistry *extreg,
          int options,upb_Arena *arena)

{
  char *__dest;
  upb_DecodeStatus uVar1;
  upb_Decoder decoder;
  undefined1 local_1b8 [168];
  upb_DecodeStatus local_110;
  
  if (((ulong)msg->field_0 & 1) == 0) {
    if (size < 0x11) {
      __dest = local_1b8 + 0x1e;
      local_1b8[0x2e] = '\0';
      local_1b8[0x2f] = '\0';
      local_1b8[0x30] = '\0';
      local_1b8[0x31] = '\0';
      local_1b8[0x32] = '\0';
      local_1b8[0x33] = '\0';
      local_1b8[0x34] = '\0';
      local_1b8[0x35] = '\0';
      local_1b8[0x36] = '\0';
      local_1b8[0x37] = '\0';
      local_1b8[0x38] = '\0';
      local_1b8[0x39] = '\0';
      local_1b8[0x3a] = '\0';
      local_1b8[0x3b] = '\0';
      local_1b8[0x3c] = '\0';
      local_1b8[0x3d] = '\0';
      local_1b8[0x1e] = '\0';
      local_1b8[0x1f] = '\0';
      local_1b8[0x20] = '\0';
      local_1b8[0x21] = '\0';
      local_1b8[0x22] = '\0';
      local_1b8[0x23] = '\0';
      local_1b8[0x24] = '\0';
      local_1b8[0x25] = '\0';
      local_1b8[0x26] = '\0';
      local_1b8[0x27] = '\0';
      local_1b8[0x28] = '\0';
      local_1b8[0x29] = '\0';
      local_1b8[0x2a] = '\0';
      local_1b8[0x2b] = '\0';
      local_1b8[0x2c] = '\0';
      local_1b8[0x2d] = '\0';
      if (size != 0) {
        memcpy(__dest,buf,size);
      }
      local_1b8._16_8_ = (long)buf - (long)__dest;
      local_1b8._0_8_ = __dest + size;
      local_1b8._24_4_ = 0;
      buf = __dest;
    }
    else {
      local_1b8._0_8_ = buf + (size - 0x10);
      local_1b8._24_4_ = 0x10;
      local_1b8._16_8_ = 0;
    }
    local_1b8[0x1d] = (_Bool)((byte)options & 1);
    local_1b8._8_8_ = local_1b8._0_8_;
    local_1b8[0x1c] = false;
    local_1b8._80_4_ = 100;
    if (0xffff < (uint)options) {
      local_1b8._80_4_ = (uint)options >> 0x10;
    }
    local_1b8._84_4_ = 0xffffffff;
    local_1b8._88_2_ = (undefined2)options;
    local_1b8[0x5a] = false;
    local_110 = kUpb_DecodeStatus_Ok;
    local_1b8._64_8_ = extreg;
    _upb_Arena_SwapIn_dont_copy_me__upb_internal_use_only((upb_Arena *)(local_1b8 + 0x60),arena);
    uVar1 = upb_Decoder_Decode((upb_Decoder *)local_1b8,buf,msg,mt,arena);
    return uVar1;
  }
  __assert_fail("!upb_Message_IsFrozen(msg)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/decode.c"
                ,0x598,
                "upb_DecodeStatus upb_Decode(const char *, size_t, upb_Message *, const upb_MiniTable *, const upb_ExtensionRegistry *, int, upb_Arena *)"
               );
}

Assistant:

upb_DecodeStatus upb_Decode(const char* buf, size_t size, upb_Message* msg,
                            const upb_MiniTable* mt,
                            const upb_ExtensionRegistry* extreg, int options,
                            upb_Arena* arena) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  upb_Decoder decoder;

  upb_EpsCopyInputStream_Init(&decoder.input, &buf, size,
                              options & kUpb_DecodeOption_AliasString);

  decoder.extreg = extreg;
  decoder.depth = upb_DecodeOptions_GetEffectiveMaxDepth(options);
  decoder.end_group = DECODE_NOGROUP;
  decoder.options = (uint16_t)options;
  decoder.missing_required = false;
  decoder.status = kUpb_DecodeStatus_Ok;

  // Violating the encapsulation of the arena for performance reasons.
  // This is a temporary arena that we swap into and swap out of when we are
  // done.  The temporary arena only needs to be able to handle allocation,
  // not fuse or free, so it does not need many of the members to be initialized
  // (particularly parent_or_count).
  UPB_PRIVATE(_upb_Arena_SwapIn)(&decoder.arena, arena);

  return upb_Decoder_Decode(&decoder, buf, msg, mt, arena);
}